

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-history.c
# Opt level: O1

_Bool history_add_full(player *p,bitflag *type,wchar_t aidx,wchar_t place,wchar_t clev,
                      wchar_t turnno,char *text)

{
  size_t *psVar1;
  size_t sVar2;
  history_info *phVar3;
  
  phVar3 = (p->hist).entries;
  if (phVar3 == (history_info *)0x0) {
    (p->hist).next = 0;
    (p->hist).length = 0x14;
    phVar3 = (history_info *)mem_zalloc(0x730);
  }
  else {
    if ((p->hist).next != (p->hist).length) goto LAB_001b9fcd;
    sVar2 = (p->hist).length + 0x14;
    (p->hist).length = sVar2;
    phVar3 = (history_info *)mem_realloc(phVar3,sVar2 * 0x5c);
  }
  (p->hist).entries = phVar3;
LAB_001b9fcd:
  flag_copy((p->hist).entries[(p->hist).next].type,type,2);
  phVar3 = (p->hist).entries;
  sVar2 = (p->hist).next;
  phVar3[sVar2].place = (int16_t)place;
  phVar3[sVar2].clev = (int16_t)clev;
  phVar3[sVar2].a_idx = (uint8_t)aidx;
  phVar3[sVar2].turn = turnno;
  my_strcpy(phVar3[sVar2].event,text,0x50);
  psVar1 = &(p->hist).next;
  *psVar1 = *psVar1 + 1;
  return true;
}

Assistant:

bool history_add_full(struct player *p,
		bitflag *type,
		int aidx,
		int place,
		int clev,
		int turnno,
		const char *text)
{
	struct player_history *h = &p->hist;

	/* Allocate or expand the history list if needed */
	if (!h->entries)
		history_init(h);
	else if (h->next == h->length)
		history_realloc(h);

	/* Add entry */
	hist_copy(h->entries[h->next].type, type);
	h->entries[h->next].place = place;
	h->entries[h->next].clev = clev;
	h->entries[h->next].a_idx = aidx;
	h->entries[h->next].turn = turnno;
	my_strcpy(h->entries[h->next].event,
			text,
			sizeof(h->entries[h->next].event));

	h->next++;

	return true;
}